

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_session.cc
# Opt level: O3

void timeout_doall_arg(SSL_SESSION *session,void *void_param)

{
  code *pcVar1;
  
  if ((*(ulong *)((long)void_param + 8) == 0) ||
     (!(bool)(~CARRY8((ulong)session->timeout,session->time) &
             *(ulong *)((long)void_param + 8) <= (ulong)session->timeout + session->time))) {
    OPENSSL_lh_delete(*(_LHASH **)((long)void_param + 0x10),session,lh_SSL_SESSION_call_hash_func,
                      lh_SSL_SESSION_call_cmp_func);
    bssl::SSL_SESSION_list_remove(*void_param,session);
    pcVar1 = *(code **)(*void_param + 0xa8);
    if (pcVar1 != (code *)0x0) {
      (*pcVar1)(*void_param,session);
    }
    if (session != (SSL_SESSION *)0x0) {
      bssl::RefCounted<ssl_session_st>::DecRefInternal(&session->super_RefCounted<ssl_session_st>);
      return;
    }
  }
  return;
}

Assistant:

static void timeout_doall_arg(SSL_SESSION *session, void *void_param) {
  TIMEOUT_PARAM *param = reinterpret_cast<TIMEOUT_PARAM *>(void_param);

  if (param->time == 0 ||                                  //
      session->time + session->timeout < session->time ||  //
      param->time > (session->time + session->timeout)) {
    // TODO(davidben): This can probably just call |remove_session|.
    (void)lh_SSL_SESSION_delete(param->cache, session);
    SSL_SESSION_list_remove(param->ctx, session);
    // TODO(https://crbug.com/boringssl/251): Callbacks should not be called
    // under a lock.
    if (param->ctx->remove_session_cb != NULL) {
      param->ctx->remove_session_cb(param->ctx, session);
    }
    SSL_SESSION_free(session);
  }
}